

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  float in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  int *in_stack_00000018;
  float in_stack_00000020;
  int in_stack_00000024;
  
  fVar1 = ImGui::GetCursorPosY();
  *in_RDI = fVar1;
  in_RDI[1] = in_XMM0_Da;
  in_RDI[2] = in_ESI;
  in_RDI[3] = 0.0;
  in_RDI[4] = -NAN;
  in_RDI[5] = -NAN;
  if (0.0 < in_RDI[1]) {
    ImGui::CalcListClipping(in_stack_00000024,in_stack_00000020,in_stack_00000018,(int *)this);
    if (0 < (int)in_RDI[4]) {
      SetCursorPosYAndSetupDummyPrevLine(in_ESI,in_XMM0_Da);
    }
    in_RDI[3] = 2.8026e-45;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    StartPosY = ImGui::GetCursorPosY();
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}